

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O1

void tcu::anon_unknown_74::floatToChannel(deUint8 *dst,float src,ChannelType type)

{
  deUint8 dVar1;
  deFloat16 dVar2;
  undefined2 uVar3;
  undefined4 uVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  float fVar9;
  float q;
  
  switch(type) {
  case SNORM_INT8:
    src = src * 127.0;
  case SIGNED_INT8:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0x7f;
    if (lVar6 < 0x7f) {
      lVar7 = lVar6;
    }
    lVar6 = -0x80;
    if (-0x80 < lVar7) {
      lVar6 = lVar7;
    }
    dVar1 = (deUint8)lVar6;
    goto LAB_005ea22d;
  case SNORM_INT16:
    src = src * 32767.0;
  case SIGNED_INT16:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0x7fff;
    if (lVar6 < 0x7fff) {
      lVar7 = lVar6;
    }
    lVar6 = -0x8000;
    if (-0x8000 < lVar7) {
      lVar6 = lVar7;
    }
    uVar3 = (undefined2)lVar6;
    goto LAB_005ea24b;
  case SNORM_INT32:
    src = src * 2.1474836e+09;
  case SIGNED_INT32:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0x7fffffff;
    if (lVar6 < 0x7fffffff) {
      lVar7 = lVar6;
    }
    uVar4 = 0x80000000;
    if (-0x80000000 < lVar7) {
      uVar4 = (undefined4)lVar7;
    }
    goto LAB_005ea1c4;
  case UNORM_INT8:
    src = src * 255.0;
  case UNSIGNED_INT8:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0xff;
    if (lVar6 < 0xff) {
      lVar7 = lVar6;
    }
    dVar1 = '\0';
    if (0 < lVar7) {
      dVar1 = (deUint8)lVar7;
    }
LAB_005ea22d:
    *dst = dVar1;
    break;
  case UNORM_INT16:
    src = src * 65535.0;
  case UNSIGNED_INT16:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0xffff;
    if (lVar6 < 0xffff) {
      lVar7 = lVar6;
    }
    uVar3 = 0;
    if (0 < lVar7) {
      uVar3 = (undefined2)lVar7;
    }
LAB_005ea24b:
    *(undefined2 *)dst = uVar3;
    break;
  case UNORM_INT24:
    src = src * 16777215.0;
  case UNSIGNED_INT24:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0xffffffff;
    if (lVar6 < 0xffffffff) {
      lVar7 = lVar6;
    }
    uVar8 = 0;
    if (0 < lVar7) {
      uVar8 = (uint)lVar7;
    }
    uVar5 = 0xffffff;
    if (uVar8 < 0xffffff) {
      uVar5 = uVar8;
    }
    *dst = (deUint8)uVar5;
    dst[1] = (deUint8)(uVar5 >> 8);
    dst[2] = (deUint8)(uVar5 >> 0x10);
    break;
  case UNORM_INT32:
    src = src * 4.2949673e+09;
  case UNSIGNED_INT32:
    fVar9 = floorf(src);
    fVar9 = src - fVar9;
    lVar6 = (long)(src - fVar9);
    if ((fVar9 != 0.5) || (NAN(fVar9))) {
      if (0.5 < fVar9) {
        lVar6 = lVar6 + 1;
      }
    }
    else {
      lVar6 = lVar6 + (ulong)((uint)lVar6 & 1);
    }
    lVar7 = 0xffffffff;
    if (lVar6 < 0xffffffff) {
      lVar7 = lVar6;
    }
    lVar6 = 0;
    if (0 < lVar7) {
      lVar6 = lVar7;
    }
    uVar4 = (undefined4)lVar6;
LAB_005ea1c4:
    *(undefined4 *)dst = uVar4;
    break;
  case HALF_FLOAT:
    dVar2 = deFloat32To16(src);
    *(deFloat16 *)dst = dVar2;
    break;
  case FLOAT:
    *(float *)dst = src;
    break;
  case FLOAT64:
    *(double *)dst = (double)src;
  }
  return;
}

Assistant:

void floatToChannel (deUint8* dst, float src, TextureFormat::ChannelType type)
{
	// make sure this table is updated if format table is updated
	DE_STATIC_ASSERT(TextureFormat::CHANNELTYPE_LAST == 38);

	switch (type)
	{
		case TextureFormat::SNORM_INT8:			*((deInt8*)dst)			= convertSatRte<deInt8>		(src * 127.0f);			break;
		case TextureFormat::SNORM_INT16:		*((deInt16*)dst)		= convertSatRte<deInt16>	(src * 32767.0f);		break;
		case TextureFormat::SNORM_INT32:		*((deInt32*)dst)		= convertSatRte<deInt32>	(src * 2147483647.0f);	break;
		case TextureFormat::UNORM_INT8:			*((deUint8*)dst)		= convertSatRte<deUint8>	(src * 255.0f);			break;
		case TextureFormat::UNORM_INT16:		*((deUint16*)dst)		= convertSatRte<deUint16>	(src * 65535.0f);		break;
		case TextureFormat::UNORM_INT24:		writeUint24(dst,		  convertSatRteUint24		(src * 16777215.0f));	break;
		case TextureFormat::UNORM_INT32:		*((deUint32*)dst)		= convertSatRte<deUint32>	(src * 4294967295.0f);	break;
		case TextureFormat::SIGNED_INT8:		*((deInt8*)dst)			= convertSatRte<deInt8>		(src);					break;
		case TextureFormat::SIGNED_INT16:		*((deInt16*)dst)		= convertSatRte<deInt16>	(src);					break;
		case TextureFormat::SIGNED_INT32:		*((deInt32*)dst)		= convertSatRte<deInt32>	(src);					break;
		case TextureFormat::UNSIGNED_INT8:		*((deUint8*)dst)		= convertSatRte<deUint8>	(src);					break;
		case TextureFormat::UNSIGNED_INT16:		*((deUint16*)dst)		= convertSatRte<deUint16>	(src);					break;
		case TextureFormat::UNSIGNED_INT24:		writeUint24(dst,		  convertSatRteUint24		(src));					break;
		case TextureFormat::UNSIGNED_INT32:		*((deUint32*)dst)		= convertSatRte<deUint32>	(src);					break;
		case TextureFormat::HALF_FLOAT:			*((deFloat16*)dst)		= deFloat32To16				(src);					break;
		case TextureFormat::FLOAT:				*((float*)dst)			= src;												break;
		case TextureFormat::FLOAT64:			*((double*)dst)			= (double)src;										break;
		default:
			DE_ASSERT(DE_FALSE);
	}
}